

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O2

bool __thiscall USDFParser::ParseConversation(USDFParser *this)

{
  FStrifeDialogueNode **ppFVar1;
  uint dlgindex;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  char *key_00;
  bool block;
  int local_40;
  FName key;
  PClassActor *local_38;
  
  dlgindex = StrifeDialogues.Count;
  uVar4 = (ulong)StrifeDialogues.Count;
  local_40 = -1;
  local_38 = (PClassActor *)0x0;
LAB_00460946:
  do {
    bVar2 = FScanner::CheckToken((FScanner *)this,0x7d);
    if (bVar2) {
      if ((local_38 == (PClassActor *)0x0) && (local_40 == 0)) {
        bVar2 = false;
        FScanner::ScriptMessage((FScanner *)this,"No valid actor type defined in conversation.");
      }
      else {
        SetConversation(local_40,local_38,dlgindex);
        ppFVar1 = StrifeDialogues.Array;
        uVar3 = (ulong)StrifeDialogues.Count;
        for (; uVar4 < uVar3; uVar4 = uVar4 + 1) {
          ppFVar1[uVar4]->SpeakerType = local_38;
        }
        bVar2 = true;
      }
      return bVar2;
    }
    UDMFParserBase::ParseKey((UDMFParserBase *)&key,SUB81(this,0),(bool *)0x1);
    if (key.Index != 0x11f) goto LAB_004609d4;
  } while ((this->super_UDMFParserBase).namespace_bits != 1);
  key_00 = FName::NameData.NameArray[0x11f].Text;
  goto LAB_004609c3;
LAB_004609d4:
  if ((key.Index == 4) &&
     (local_38 = CheckActorType(this,FName::NameData.NameArray[4].Text),
     (this->super_UDMFParserBase).namespace_bits == 2)) {
    key_00 = FName::NameData.NameArray[key.Index].Text;
LAB_004609c3:
    local_40 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,key_00);
  }
  goto LAB_00460946;
}

Assistant:

bool ParseConversation()
	{
		PClassActor *type = NULL;
		int dlgid = -1;
		unsigned int startpos = StrifeDialogues.Size();

		while (!sc.CheckToken('}'))
		{
			bool block = false;
			FName key = ParseKey(true, &block);
			if (!block)
			{
				switch(key)
				{
				case NAME_Actor:
					type = CheckActorType(key);
					if (namespace_bits == St)
					{
						dlgid = CheckInt(key);
					}
					break;

				case NAME_Id:
					if (namespace_bits == Zd)
					{
						dlgid = CheckInt(key);
					}
					break;
				}
			}
			else
			{
				switch(key)
				{
				case NAME_Page:
					if (!ParsePage()) return false;
					break;

				default:
					sc.UnGet();
					Skip();
				}
			}
		}
		if (type == NULL && dlgid == 0)
		{
			sc.ScriptMessage("No valid actor type defined in conversation.");
			return false;
		}
		SetConversation(dlgid, type, startpos);
		for(;startpos < StrifeDialogues.Size(); startpos++)
		{
			StrifeDialogues[startpos]->SpeakerType = type;
		}
		return true;
	}